

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

bool slang::syntax::SyntaxFacts::isPossibleStatement(TokenKind kind)

{
  TokenKind kind_local;
  bool local_1;
  
  switch(kind) {
  case Identifier:
  case SystemIdentifier:
  case ApostropheOpenBrace:
  case OpenBrace:
  case OpenParenthesis:
  case Semicolon:
  case DoublePlus:
  case DoubleMinus:
  case MinusArrow:
  case MinusDoubleArrow:
  case Hash:
  case DoubleHash:
  case At:
  case AssertKeyword:
  case AssignKeyword:
  case AssumeKeyword:
  case BeginKeyword:
  case BreakKeyword:
  case CaseKeyword:
  case CaseXKeyword:
  case CaseZKeyword:
  case ContinueKeyword:
  case CoverKeyword:
  case DeassignKeyword:
  case DisableKeyword:
  case DoKeyword:
  case ExpectKeyword:
  case ForKeyword:
  case ForceKeyword:
  case ForeachKeyword:
  case ForeverKeyword:
  case ForkKeyword:
  case IfKeyword:
  case PriorityKeyword:
  case RandCaseKeyword:
  case RandSequenceKeyword:
  case ReleaseKeyword:
  case RepeatKeyword:
  case RestrictKeyword:
  case ReturnKeyword:
  case SuperKeyword:
  case ThisKeyword:
  case TypeKeyword:
  case UniqueKeyword:
  case Unique0Keyword:
  case VoidKeyword:
  case WaitKeyword:
  case WaitOrderKeyword:
  case WhileKeyword:
  case UnitSystemName:
  case RootSystemName:
    local_1 = true;
    break;
  default:
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SyntaxFacts::isPossibleStatement(TokenKind kind) {
    switch (kind) {
        case TokenKind::Identifier:
        case TokenKind::SystemIdentifier:
        case TokenKind::ThisKeyword:
        case TokenKind::SuperKeyword:
        case TokenKind::UnitSystemName:
        case TokenKind::RootSystemName:
        case TokenKind::OpenBrace:
        case TokenKind::ApostropheOpenBrace:
        case TokenKind::AssignKeyword:
        case TokenKind::DeassignKeyword:
        case TokenKind::ForceKeyword:
        case TokenKind::ReleaseKeyword:
        case TokenKind::UniqueKeyword:
        case TokenKind::Unique0Keyword:
        case TokenKind::PriorityKeyword:
        case TokenKind::CaseKeyword:
        case TokenKind::CaseXKeyword:
        case TokenKind::CaseZKeyword:
        case TokenKind::IfKeyword:
        case TokenKind::DoublePlus:
        case TokenKind::DoubleMinus:
        case TokenKind::VoidKeyword:
        case TokenKind::TypeKeyword:
        case TokenKind::DisableKeyword:
        case TokenKind::MinusArrow:
        case TokenKind::MinusDoubleArrow:
        case TokenKind::ForeverKeyword:
        case TokenKind::RepeatKeyword:
        case TokenKind::WhileKeyword:
        case TokenKind::ForKeyword:
        case TokenKind::DoKeyword:
        case TokenKind::ForeachKeyword:
        case TokenKind::ReturnKeyword:
        case TokenKind::BreakKeyword:
        case TokenKind::ContinueKeyword:
        case TokenKind::ForkKeyword:
        case TokenKind::Hash:
        case TokenKind::DoubleHash:
        case TokenKind::At:
        case TokenKind::BeginKeyword:
        case TokenKind::WaitKeyword:
        case TokenKind::WaitOrderKeyword:
        case TokenKind::AssertKeyword:
        case TokenKind::AssumeKeyword:
        case TokenKind::CoverKeyword:
        case TokenKind::RestrictKeyword:
        case TokenKind::RandSequenceKeyword:
        case TokenKind::RandCaseKeyword:
        case TokenKind::ExpectKeyword:
        case TokenKind::OpenParenthesis:
        case TokenKind::Semicolon:
            return true;
        default:
            return false;
    }
}